

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arc.cpp
# Opt level: O0

bool __thiscall ON_Arc::Create(ON_Arc *this,ON_2dPoint *P,ON_2dPoint *Q,ON_2dPoint *R)

{
  bool bVar1;
  ON_Interval local_f0 [2];
  ON_3dPoint local_d0;
  double local_b8;
  double a;
  ON_Circle c;
  ON_2dPoint *R_local;
  ON_2dPoint *Q_local;
  ON_2dPoint *P_local;
  ON_Arc *this_local;
  
  c.radius = (double)R;
  ON_Circle::ON_Circle((ON_Circle *)&a,P,Q,R);
  local_b8 = 0.0;
  ON_3dPoint::ON_3dPoint(&local_d0,(ON_2dPoint *)c.radius);
  ON_Circle::ClosestPointTo((ON_Circle *)&a,&local_d0,&local_b8);
  ON_Interval::ON_Interval(local_f0,0.0,local_b8);
  bVar1 = Create(this,(ON_Circle *)&a,local_f0[0]);
  ON_Circle::~ON_Circle((ON_Circle *)&a);
  return bVar1;
}

Assistant:

bool ON_Arc::Create( // arc through 3 2d points
  const ON_2dPoint& P, // point P
  const ON_2dPoint& Q, // point Q
  const ON_2dPoint& R // point R
  )
{
  ON_Circle c(P,Q,R);
  double a = 0.0;
  c.ClosestPointTo( ON_3dPoint(R), &a );
  return Create( c, ON_Interval(0.0,a) );
}